

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

TSTree * ts_tree_new(Subtree root,TSLanguage *language,TSRange *included_ranges,
                    uint included_range_count)

{
  Subtree *pSVar1;
  SubtreeHeapData *pSVar2;
  TSTree *result;
  uint included_range_count_local;
  TSRange *included_ranges_local;
  TSLanguage *language_local;
  Subtree root_local;
  
  pSVar1 = (Subtree *)ts_malloc(0x30);
  *pSVar1 = root;
  pSVar1[1].ptr = (SubtreeHeapData *)language;
  pSVar1[2].ptr = (SubtreeHeapData *)0x0;
  *(uint32_t *)(pSVar1 + 3) = 0;
  *(uint32_t *)((long)pSVar1 + 0x1c) = 0;
  pSVar2 = (SubtreeHeapData *)ts_calloc((ulong)included_range_count,0x18);
  pSVar1[4].ptr = pSVar2;
  memcpy(pSVar1[4].ptr,included_ranges,(ulong)included_range_count * 0x18);
  *(uint *)(pSVar1 + 5) = included_range_count;
  return (TSTree *)pSVar1;
}

Assistant:

TSTree *ts_tree_new(
  Subtree root, const TSLanguage *language,
  const TSRange *included_ranges, unsigned included_range_count
) {
  TSTree *result = ts_malloc(sizeof(TSTree));
  result->root = root;
  result->language = language;
  result->parent_cache = NULL;
  result->parent_cache_start = 0;
  result->parent_cache_size = 0;
  result->included_ranges = ts_calloc(included_range_count, sizeof(TSRange));
  memcpy(result->included_ranges, included_ranges, included_range_count * sizeof(TSRange));
  result->included_range_count = included_range_count;
  return result;
}